

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_LookupTable(LookupTableForm1 LookupTable)

{
  uint8_t uVar1;
  bool bVar2;
  byte *pbVar3;
  reference pvVar4;
  code *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> normalized;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> lookupTable;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined8 in_stack_fffffffffffffed8;
  size_type sVar5;
  value_type isAnyValue;
  allocator_type *in_stack_fffffffffffffee8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  allocator_type *in_stack_fffffffffffffef0;
  Image *image;
  size_type in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  value_type vVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff48;
  undefined1 local_a0 [47];
  undefined1 local_71;
  Image local_70;
  undefined1 local_48 [40];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  local_8 = in_RDI;
  Unit_Test::intensityArray((uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  Unit_Test::randomImage(in_stack_ffffffffffffff48);
  local_71 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1d9ac4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
             ,(value_type_conflict *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1d9af2);
  uVar1 = Unit_Test::intensityValue();
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,
                      (ulong)*pbVar3);
  *pvVar4 = uVar1;
  uVar1 = Unit_Test::intensityValue();
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,
                      (ulong)*pbVar3);
  *pvVar4 = uVar1;
  (*local_8)(local_a0,local_48,&local_70);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1d9b90);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
             ,in_stack_fffffffffffffef0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1d9bb0);
  sVar5 = 0;
  this = &local_20;
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,0);
  image = &local_70;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image,(ulong)*pbVar3)
  ;
  isAnyValue = *pvVar4;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &stack0xffffffffffffff48,sVar5);
  *pvVar4 = isAnyValue;
  sVar5 = 1;
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,1);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image,(ulong)*pbVar3)
  ;
  vVar6 = *pvVar4;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &stack0xffffffffffffff48,sVar5);
  *pvVar4 = vVar6;
  bVar2 = Unit_Test::verifyImage(image,this,(bool)isAnyValue);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d9c72);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d9c8c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  return bVar2;
}

Assistant:

bool form1_LookupTable(LookupTableForm1 LookupTable)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input = randomImage( intensity );

        std::vector < uint8_t > lookupTable( 256, 0 );

        lookupTable[intensity[0]] = intensityValue();
        lookupTable[intensity[1]] = intensityValue();

        const PenguinV_Image::Image output = LookupTable( input, lookupTable );

        std::vector < uint8_t > normalized( 2 );

        normalized[0] = lookupTable[intensity[0]];
        normalized[1] = lookupTable[intensity[1]];

        return verifyImage( output, normalized );
    }